

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar8;
  uint uVar9;
  undefined1 auVar6 [16];
  __m128i alVar7;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  undefined1 auVar13 [16];
  __m128i alVar14;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  undefined1 auVar23 [16];
  int iVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  __m128i offset;
  undefined1 auVar36 [16];
  int iVar37;
  int iVar39;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  uint uVar42;
  uint uVar45;
  uint uVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  
  auVar36 = ZEXT416((uint)bit);
  lVar4 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x170);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x250);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  auVar13 = pmulld(auVar13,(undefined1  [16])*in);
  alVar14[0]._0_4_ = auVar13._0_4_ + iVar3 >> auVar36;
  alVar14[0]._4_4_ = auVar13._4_4_ + iVar3 >> auVar36;
  alVar14[1]._0_4_ = auVar13._8_4_ + iVar3 >> auVar36;
  alVar14[1]._4_4_ = auVar13._12_4_ + iVar3 >> auVar36;
  auVar13 = pmulld(auVar43,(undefined1  [16])*in);
  auVar30._0_4_ = iVar3 - auVar13._0_4_ >> auVar36;
  auVar30._4_4_ = iVar3 - auVar13._4_4_ >> auVar36;
  auVar30._8_4_ = iVar3 - auVar13._8_4_ >> auVar36;
  auVar30._12_4_ = iVar3 - auVar13._12_4_ >> auVar36;
  auVar43 = pmulld((undefined1  [16])alVar14,auVar23);
  auVar13 = pmulld(auVar30,auVar6);
  auVar44._0_4_ = auVar43._0_4_ + iVar3 + auVar13._0_4_ >> auVar36;
  auVar44._4_4_ = auVar43._4_4_ + iVar3 + auVar13._4_4_ >> auVar36;
  auVar44._8_4_ = auVar43._8_4_ + iVar3 + auVar13._8_4_ >> auVar36;
  auVar44._12_4_ = auVar43._12_4_ + iVar3 + auVar13._12_4_ >> auVar36;
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar6 = pmulld(auVar6,(undefined1  [16])alVar14);
  auVar13 = pmulld(auVar23,auVar30);
  alVar7[0]._0_4_ = (auVar6._0_4_ + iVar3) - auVar13._0_4_ >> auVar36;
  alVar7[0]._4_4_ = (auVar6._4_4_ + iVar3) - auVar13._4_4_ >> auVar36;
  alVar7[1]._0_4_ = (auVar6._8_4_ + iVar3) - auVar13._8_4_ >> auVar36;
  alVar7[1]._4_4_ = (auVar6._12_4_ + iVar3) - auVar13._12_4_ >> auVar36;
  auVar6 = pmulld((undefined1  [16])alVar14,auVar38);
  auVar13 = pmulld(auVar30,auVar38);
  iVar21 = auVar6._0_4_ + iVar3;
  iVar24 = auVar6._4_4_ + iVar3;
  iVar26 = auVar6._8_4_ + iVar3;
  iVar28 = auVar6._12_4_ + iVar3;
  iVar48 = iVar21 + auVar13._0_4_ >> auVar36;
  iVar50 = iVar24 + auVar13._4_4_ >> auVar36;
  iVar52 = iVar26 + auVar13._8_4_ >> auVar36;
  iVar54 = iVar28 + auVar13._12_4_ >> auVar36;
  uVar22 = iVar21 - auVar13._0_4_ >> auVar36;
  uVar25 = iVar24 - auVar13._4_4_ >> auVar36;
  uVar27 = iVar26 - auVar13._8_4_ >> auVar36;
  uVar29 = iVar28 - auVar13._12_4_ >> auVar36;
  auVar13 = pmulld(auVar44,auVar38);
  auVar6 = pmulld(auVar38,(undefined1  [16])alVar7);
  iVar21 = auVar13._0_4_ + iVar3;
  iVar24 = auVar13._4_4_ + iVar3;
  iVar26 = auVar13._8_4_ + iVar3;
  iVar3 = auVar13._12_4_ + iVar3;
  uVar31 = iVar21 + auVar6._0_4_ >> auVar36;
  uVar32 = iVar24 + auVar6._4_4_ >> auVar36;
  uVar33 = iVar26 + auVar6._8_4_ >> auVar36;
  uVar34 = iVar3 + auVar6._12_4_ >> auVar36;
  iVar21 = iVar21 - auVar6._0_4_ >> auVar36;
  iVar24 = iVar24 - auVar6._4_4_ >> auVar36;
  iVar26 = iVar26 - auVar6._8_4_ >> auVar36;
  iVar3 = iVar3 - auVar6._12_4_ >> auVar36;
  if (do_cols == 0) {
    iVar28 = 10;
    if (10 < bd) {
      iVar28 = bd;
    }
    iVar28 = 0x20 << ((byte)iVar28 & 0x1f);
    iVar2 = -iVar28;
    iVar28 = iVar28 + -1;
    iVar35 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar6 = ZEXT416((uint)out_shift);
    iVar11 = (int)((uint)alVar14[0] + iVar35) >> auVar6;
    iVar15 = (int)(alVar14[0]._4_4_ + iVar35) >> auVar6;
    iVar17 = (int)((uint)alVar14[1] + iVar35) >> auVar6;
    iVar19 = (int)(alVar14[1]._4_4_ + iVar35) >> auVar6;
    iVar37 = iVar35 - auVar44._0_4_ >> auVar6;
    iVar39 = iVar35 - auVar44._4_4_ >> auVar6;
    iVar40 = iVar35 - auVar44._8_4_ >> auVar6;
    iVar41 = iVar35 - auVar44._12_4_ >> auVar6;
    uVar12 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
    uVar16 = (uint)(iVar15 < iVar2) * iVar2 | (uint)(iVar15 >= iVar2) * iVar15;
    uVar18 = (uint)(iVar17 < iVar2) * iVar2 | (uint)(iVar17 >= iVar2) * iVar17;
    uVar20 = (uint)(iVar19 < iVar2) * iVar2 | (uint)(iVar19 >= iVar2) * iVar19;
    alVar14[0]._0_4_ = (uint)(iVar28 < (int)uVar12) * iVar28 | (iVar28 >= (int)uVar12) * uVar12;
    alVar14[0]._4_4_ = (uint)(iVar28 < (int)uVar16) * iVar28 | (iVar28 >= (int)uVar16) * uVar16;
    alVar14[1]._0_4_ = (uint)(iVar28 < (int)uVar18) * iVar28 | (iVar28 >= (int)uVar18) * uVar18;
    alVar14[1]._4_4_ = (uint)(iVar28 < (int)uVar20) * iVar28 | (iVar28 >= (int)uVar20) * uVar20;
    uVar12 = (uint)(iVar37 < iVar2) * iVar2 | (uint)(iVar37 >= iVar2) * iVar37;
    uVar16 = (uint)(iVar39 < iVar2) * iVar2 | (uint)(iVar39 >= iVar2) * iVar39;
    uVar18 = (uint)(iVar40 < iVar2) * iVar2 | (uint)(iVar40 >= iVar2) * iVar40;
    uVar20 = (uint)(iVar41 < iVar2) * iVar2 | (uint)(iVar41 >= iVar2) * iVar41;
    uVar12 = (uint)(iVar28 < (int)uVar12) * iVar28 | (iVar28 >= (int)uVar12) * uVar12;
    uVar16 = (uint)(iVar28 < (int)uVar16) * iVar28 | (iVar28 >= (int)uVar16) * uVar16;
    uVar18 = (uint)(iVar28 < (int)uVar18) * iVar28 | (iVar28 >= (int)uVar18) * uVar18;
    uVar20 = (uint)(iVar28 < (int)uVar20) * iVar28 | (iVar28 >= (int)uVar20) * uVar20;
    iVar11 = (int)(uVar31 + iVar35) >> auVar6;
    iVar15 = (int)(uVar32 + iVar35) >> auVar6;
    iVar17 = (int)(uVar33 + iVar35) >> auVar6;
    iVar19 = (int)(uVar34 + iVar35) >> auVar6;
    iVar48 = iVar35 - iVar48 >> auVar6;
    iVar50 = iVar35 - iVar50 >> auVar6;
    iVar52 = iVar35 - iVar52 >> auVar6;
    iVar54 = iVar35 - iVar54 >> auVar6;
    uVar31 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
    uVar32 = (uint)(iVar15 < iVar2) * iVar2 | (uint)(iVar15 >= iVar2) * iVar15;
    uVar33 = (uint)(iVar17 < iVar2) * iVar2 | (uint)(iVar17 >= iVar2) * iVar17;
    uVar34 = (uint)(iVar19 < iVar2) * iVar2 | (uint)(iVar19 >= iVar2) * iVar19;
    uVar31 = (uint)(iVar28 < (int)uVar31) * iVar28 | (iVar28 >= (int)uVar31) * uVar31;
    uVar32 = (uint)(iVar28 < (int)uVar32) * iVar28 | (iVar28 >= (int)uVar32) * uVar32;
    uVar33 = (uint)(iVar28 < (int)uVar33) * iVar28 | (iVar28 >= (int)uVar33) * uVar33;
    uVar34 = (uint)(iVar28 < (int)uVar34) * iVar28 | (iVar28 >= (int)uVar34) * uVar34;
    uVar42 = (uint)(iVar48 < iVar2) * iVar2 | (uint)(iVar48 >= iVar2) * iVar48;
    uVar45 = (uint)(iVar50 < iVar2) * iVar2 | (uint)(iVar50 >= iVar2) * iVar50;
    uVar46 = (uint)(iVar52 < iVar2) * iVar2 | (uint)(iVar52 >= iVar2) * iVar52;
    uVar47 = (uint)(iVar54 < iVar2) * iVar2 | (uint)(iVar54 >= iVar2) * iVar54;
    uVar42 = (uint)(iVar28 < (int)uVar42) * iVar28 | (iVar28 >= (int)uVar42) * uVar42;
    uVar45 = (uint)(iVar28 < (int)uVar45) * iVar28 | (iVar28 >= (int)uVar45) * uVar45;
    uVar46 = (uint)(iVar28 < (int)uVar46) * iVar28 | (iVar28 >= (int)uVar46) * uVar46;
    uVar47 = (uint)(iVar28 < (int)uVar47) * iVar28 | (iVar28 >= (int)uVar47) * uVar47;
    iVar48 = (int)(uVar22 + iVar35) >> auVar6;
    iVar50 = (int)(uVar25 + iVar35) >> auVar6;
    iVar52 = (int)(uVar27 + iVar35) >> auVar6;
    iVar54 = (int)(uVar29 + iVar35) >> auVar6;
    iVar21 = iVar35 - iVar21 >> auVar6;
    iVar24 = iVar35 - iVar24 >> auVar6;
    iVar26 = iVar35 - iVar26 >> auVar6;
    iVar3 = iVar35 - iVar3 >> auVar6;
    uVar22 = (uint)(iVar48 < iVar2) * iVar2 | (uint)(iVar48 >= iVar2) * iVar48;
    uVar25 = (uint)(iVar50 < iVar2) * iVar2 | (uint)(iVar50 >= iVar2) * iVar50;
    uVar27 = (uint)(iVar52 < iVar2) * iVar2 | (uint)(iVar52 >= iVar2) * iVar52;
    uVar29 = (uint)(iVar54 < iVar2) * iVar2 | (uint)(iVar54 >= iVar2) * iVar54;
    uVar22 = (uint)(iVar28 < (int)uVar22) * iVar28 | (iVar28 >= (int)uVar22) * uVar22;
    uVar25 = (uint)(iVar28 < (int)uVar25) * iVar28 | (iVar28 >= (int)uVar25) * uVar25;
    uVar27 = (uint)(iVar28 < (int)uVar27) * iVar28 | (iVar28 >= (int)uVar27) * uVar27;
    uVar29 = (uint)(iVar28 < (int)uVar29) * iVar28 | (iVar28 >= (int)uVar29) * uVar29;
    uVar49 = (uint)(iVar21 < iVar2) * iVar2 | (uint)(iVar21 >= iVar2) * iVar21;
    uVar51 = (uint)(iVar24 < iVar2) * iVar2 | (uint)(iVar24 >= iVar2) * iVar24;
    uVar53 = (uint)(iVar26 < iVar2) * iVar2 | (uint)(iVar26 >= iVar2) * iVar26;
    uVar55 = (uint)(iVar3 < iVar2) * iVar2 | (uint)(iVar3 >= iVar2) * iVar3;
    uVar49 = (uint)(iVar28 < (int)uVar49) * iVar28 | (iVar28 >= (int)uVar49) * uVar49;
    uVar51 = (uint)(iVar28 < (int)uVar51) * iVar28 | (iVar28 >= (int)uVar51) * uVar51;
    uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
    uVar55 = (uint)(iVar28 < (int)uVar55) * iVar28 | (iVar28 >= (int)uVar55) * uVar55;
    iVar3 = (int)((uint)alVar7[0] + iVar35) >> auVar6;
    iVar21 = (int)(alVar7[0]._4_4_ + iVar35) >> auVar6;
    iVar24 = (int)((uint)alVar7[1] + iVar35) >> auVar6;
    iVar26 = (int)(alVar7[1]._4_4_ + iVar35) >> auVar6;
    iVar48 = iVar35 - auVar30._0_4_ >> auVar6;
    iVar50 = iVar35 - auVar30._4_4_ >> auVar6;
    iVar52 = iVar35 - auVar30._8_4_ >> auVar6;
    iVar54 = iVar35 - auVar30._12_4_ >> auVar6;
    uVar5 = (uint)(iVar3 < iVar2) * iVar2 | (uint)(iVar3 >= iVar2) * iVar3;
    uVar8 = (uint)(iVar21 < iVar2) * iVar2 | (uint)(iVar21 >= iVar2) * iVar21;
    uVar9 = (uint)(iVar24 < iVar2) * iVar2 | (uint)(iVar24 >= iVar2) * iVar24;
    uVar10 = (uint)(iVar26 < iVar2) * iVar2 | (uint)(iVar26 >= iVar2) * iVar26;
    alVar7[0]._0_4_ = (uint)(iVar28 < (int)uVar5) * iVar28 | (iVar28 >= (int)uVar5) * uVar5;
    alVar7[0]._4_4_ = (uint)(iVar28 < (int)uVar8) * iVar28 | (iVar28 >= (int)uVar8) * uVar8;
    alVar7[1]._0_4_ = (uint)(iVar28 < (int)uVar9) * iVar28 | (iVar28 >= (int)uVar9) * uVar9;
    alVar7[1]._4_4_ = (uint)(iVar28 < (int)uVar10) * iVar28 | (iVar28 >= (int)uVar10) * uVar10;
    uVar5 = (uint)(iVar48 < iVar2) * iVar2 | (uint)(iVar48 >= iVar2) * iVar48;
    uVar8 = (uint)(iVar50 < iVar2) * iVar2 | (uint)(iVar50 >= iVar2) * iVar50;
    uVar9 = (uint)(iVar52 < iVar2) * iVar2 | (uint)(iVar52 >= iVar2) * iVar52;
    uVar10 = (uint)(iVar54 < iVar2) * iVar2 | (uint)(iVar54 >= iVar2) * iVar54;
    uVar5 = (uint)(iVar28 < (int)uVar5) * iVar28 | (iVar28 >= (int)uVar5) * uVar5;
    uVar8 = (uint)(iVar28 < (int)uVar8) * iVar28 | (iVar28 >= (int)uVar8) * uVar8;
    uVar9 = (uint)(iVar28 < (int)uVar9) * iVar28 | (iVar28 >= (int)uVar9) * uVar9;
    uVar10 = (uint)(iVar28 < (int)uVar10) * iVar28 | (iVar28 >= (int)uVar10) * uVar10;
  }
  else {
    uVar12 = -auVar44._0_4_;
    uVar16 = -auVar44._4_4_;
    uVar18 = -auVar44._8_4_;
    uVar20 = -auVar44._12_4_;
    uVar42 = -iVar48;
    uVar45 = -iVar50;
    uVar46 = -iVar52;
    uVar47 = -iVar54;
    uVar49 = -iVar21;
    uVar51 = -iVar24;
    uVar53 = -iVar26;
    uVar55 = -iVar3;
    uVar5 = -auVar30._0_4_;
    uVar8 = -auVar30._4_4_;
    uVar9 = -auVar30._8_4_;
    uVar10 = -auVar30._12_4_;
  }
  *out = alVar14;
  *(uint *)out[1] = uVar12;
  *(uint *)((long)out[1] + 4) = uVar16;
  *(uint *)(out[1] + 1) = uVar18;
  *(uint *)((long)out[1] + 0xc) = uVar20;
  *(uint *)out[2] = uVar31;
  *(uint *)((long)out[2] + 4) = uVar32;
  *(uint *)(out[2] + 1) = uVar33;
  *(uint *)((long)out[2] + 0xc) = uVar34;
  *(uint *)out[3] = uVar42;
  *(uint *)((long)out[3] + 4) = uVar45;
  *(uint *)(out[3] + 1) = uVar46;
  *(uint *)((long)out[3] + 0xc) = uVar47;
  *(uint *)out[4] = uVar22;
  *(uint *)((long)out[4] + 4) = uVar25;
  *(uint *)(out[4] + 1) = uVar27;
  *(uint *)((long)out[4] + 0xc) = uVar29;
  *(uint *)out[5] = uVar49;
  *(uint *)((long)out[5] + 4) = uVar51;
  *(uint *)(out[5] + 1) = uVar53;
  *(uint *)((long)out[5] + 0xc) = uVar55;
  out[6] = alVar7;
  *(uint *)out[7] = uVar5;
  *(uint *)((long)out[7] + 4) = uVar8;
  *(uint *)(out[7] + 1) = uVar9;
  *(uint *)((long)out[7] + 0xc) = uVar10;
  return;
}

Assistant:

static void iadst8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                 int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  __m128i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(kZero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m128i temp1, temp2;
  temp1 = _mm_mullo_epi32(u[0], cospi16);
  x = _mm_mullo_epi32(u[1], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm_mullo_epi32(u[0], cospi48);
  x = _mm_mullo_epi32(u[1], cospi16);
  u[5] = _mm_sub_epi32(temp2, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm_mullo_epi32(u[0], cospi32);
  x = _mm_mullo_epi32(u[1], cospi32);
  u[2] = _mm_add_epi32(temp1, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(temp1, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  temp1 = _mm_mullo_epi32(u[4], cospi32);
  x = _mm_mullo_epi32(u[5], cospi32);
  u[6] = _mm_add_epi32(temp1, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(temp1, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}